

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O3

DoublePrecision
pnga_ddot_patch_dp(Integer g_a,char *t_a,Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,
                  Integer g_b,char *t_b,Integer bilo,Integer bihi,Integer bjlo,Integer bjhi)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Integer proc;
  Integer IVar4;
  void *pvVar5;
  long lVar6;
  Integer IVar7;
  long lVar8;
  long lVar9;
  DoublePrecision DVar10;
  Integer blo [2];
  DoublePrecision *dbl_ptrB;
  Integer ldB;
  DoublePrecision *dbl_ptrA;
  Integer ldA;
  Integer btype;
  Integer ahi [2];
  Integer alo [2];
  Integer ndim;
  Integer atype;
  Integer dims [2];
  void *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  void *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  byte *local_a0;
  Integer local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Integer local_58;
  long local_50;
  long local_48;
  long local_40;
  
  local_a0 = (byte *)t_a;
  local_98 = pnga_nodeid();
  pnga_check_handle(g_a,"pnga_ddot_patch_dp");
  pnga_check_handle(g_b,"pnga_ddot_patch_dp");
  pnga_inquire(g_a,&local_50,&local_58,&local_48);
  lVar1 = local_40;
  lVar8 = local_48;
  pnga_inquire(g_b,&local_80,&local_58,&local_48);
  if ((local_50 != 0x3ec) || (local_80 != 0x3ec)) {
    pnga_error("pnga_ddot_patch_dp: wrong types ",0);
  }
  if ((((ailo < 1) || (ajlo < 1)) || (lVar8 < aihi)) || (lVar1 < ajhi)) {
    pnga_error(" pnga_ddot_patch_dp: g_a indices out of range ",0);
  }
  if (((bilo < 1) || (bjlo < 1)) || ((local_48 < bihi || (local_40 < bjhi)))) {
    pnga_error(" pnga_ddot_patch_dp: g_b indices out of range ",0);
  }
  IVar7 = local_98;
  if (((*t_b & 0xdfU) == 0x4e) == ((*local_a0 & 0xdf) != 0x4e)) {
    pnga_error(" pnga_ddot_patch_dp: transpose operators don\'t match: ",local_98);
  }
  pnga_distribution(g_a,IVar7,&local_68,&local_78);
  DVar10 = 0.0;
  if (((local_60 <= local_70 && (local_68 <= local_78 && (ajlo <= ajhi && ailo <= aihi))) &&
      (ailo <= local_78 && local_68 <= aihi)) && (ajlo <= local_70 && local_60 <= ajhi)) {
    IVar7 = local_68;
    if (local_68 <= ailo) {
      IVar7 = ailo;
    }
    if (local_78 < aihi) {
      aihi = local_78;
    }
    IVar4 = local_60;
    if (local_60 <= ajlo) {
      IVar4 = ajlo;
    }
    if (local_70 < ajhi) {
      ajhi = local_70;
    }
    pnga_access_ptr(g_a,&local_68,&local_78,&local_90,&local_88);
    lVar8 = (bilo - ailo) + IVar7;
    pvVar5 = (void *)((bilo - ailo) + aihi);
    lVar1 = IVar4 + (bjlo - ajlo);
    lVar6 = (bjlo - ajlo) + ajhi;
    local_e8 = pvVar5;
    local_e0 = lVar6;
    local_d8 = lVar8;
    local_d0 = lVar1;
    proc = pnga_nodeid();
    pnga_distribution(g_b,proc,&local_b8,(Integer *)&local_c8);
    bVar3 = lVar8 == local_b8;
    bVar2 = pvVar5 == local_c8;
    if (lVar1 == local_b0 && ((lVar6 == local_c0 && bVar3) && bVar2)) {
      pnga_access_ptr(g_b,&local_d8,(Integer *)&local_e8,&local_c8,&local_b8);
      lVar8 = ajhi - IVar4;
    }
    else {
      lVar9 = (aihi - IVar7) + 1;
      lVar8 = ajhi - IVar4;
      local_c8 = pnga_malloc((lVar8 + 1) * lVar9,0x3f5,"ddot_dp_b");
      local_b8 = lVar9;
      pnga_get(g_b,&local_d8,(Integer *)&local_e8,local_c8,&local_b8);
    }
    if (lVar8 < 0) {
      DVar10 = 0.0;
    }
    else {
      DVar10 = 0.0;
      lVar8 = 0;
      pvVar5 = local_c8;
      do {
        if (IVar7 <= aihi) {
          lVar9 = 0;
          do {
            DVar10 = DVar10 + *(double *)(local_90 + lVar9 * 8) *
                              *(double *)((long)pvVar5 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while ((aihi - IVar7) + 1 != lVar9);
        }
        lVar8 = lVar8 + 1;
        pvVar5 = (void *)((long)pvVar5 + local_b8 * 8);
        local_90 = local_90 + local_88 * 8;
      } while (lVar8 != (ajhi - IVar4) + 1);
    }
    pnga_release(g_a,&local_68,&local_78);
    if (lVar1 == local_b0 && ((lVar6 == local_c0 && bVar3) && bVar2)) {
      pnga_release(g_b,&local_d8,(Integer *)&local_e8);
    }
    else {
      pnga_free(local_c8);
    }
  }
  return DVar10;
}

Assistant:

DoublePrecision pnga_ddot_patch_dp(g_a, t_a, ailo, aihi, ajlo, ajhi,
                                  g_b, t_b, bilo, bihi, bjlo, bjhi)
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     char    *t_a, *t_b;                          /* transpose operators */
{
Integer atype, btype, adim1, adim2, bdim1, bdim2;
Integer iloA, ihiA, jloA, jhiA, ldA;
Integer iloB, ihiB, jloB, jhiB, ldB;
Integer alo[2], ahi[2];
Integer blo[2], bhi[2];
Integer g_A = g_a;
Integer me= pnga_nodeid(), i, j, temp_created=0;
Integer corr, nelem;
char    transp, transp_a, transp_b;
DoublePrecision  sum = 0.;
DoublePrecision *dbl_ptrA;
DoublePrecision *dbl_ptrB;
Integer ndim, dims[2];

   pnga_check_handle(g_a, "pnga_ddot_patch_dp");
   pnga_check_handle(g_b, "pnga_ddot_patch_dp");

   pnga_inquire(g_a, &atype, &ndim, dims);
   adim1 = dims[0];
   adim2 = dims[1];
   pnga_inquire(g_b, &btype, &ndim, dims);
   bdim1 = dims[0];
   bdim2 = dims[1];

   if(atype != btype || (atype != C_DBL ))
      pnga_error("pnga_ddot_patch_dp: wrong types ", 0L);

  /* check if patch indices and g_a dims match */
   if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
      pnga_error(" pnga_ddot_patch_dp: g_a indices out of range ", 0L);

   /* check if patch indices and g_b dims match */
   if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error(" pnga_ddot_patch_dp: g_b indices out of range ", 0L);


   /* is transpose operation required ? */
   /* -- only if for one array transpose operation requested*/
   transp_a = (*t_a == 'n' || *t_a =='N')? 'n' : 't';
   transp_b = (*t_b == 'n' || *t_b =='N')? 'n' : 't';
   transp   = (transp_a == transp_b)? 'n' : 't';
   if(transp == 't')
          pnga_error(" pnga_ddot_patch_dp: transpose operators don't match: ", me);


   /* find out coordinates of patches of g_A and g_B that I own */
   pnga_distribution(g_A, me, alo, ahi);
   iloA = alo[0];
   jloA = alo[1];
   ihiA = ahi[0];
   jhiA = ahi[1];

   if (patch_intersect(ailo, aihi, ajlo, ajhi, &iloA, &ihiA, &jloA, &jhiA)){

       pnga_access_ptr(g_A, alo, ahi, &dbl_ptrA, &ldA);
       nelem = (ihiA-iloA+1)*(jhiA-jloA+1);

       corr  = bilo - ailo;
       iloB  = iloA + corr;
       ihiB  = ihiA + corr;
       corr  = bjlo - ajlo;
       jloB  = jloA + corr;
       jhiB  = jhiA + corr;
       blo[0] = iloB; blo[1] = jloB;
       bhi[0] = ihiB; bhi[1] = jhiB;

      if(own_patch(g_b, iloB, ihiB, jloB, jhiB)){
         /* all the data is local */
         pnga_access_ptr(g_b, blo, bhi, &dbl_ptrB, &ldB);
      }else{
         /* data is remote -- get it to temp storage*/
         temp_created =1;
	      dbl_ptrB = (DoublePrecision*)pnga_malloc(nelem, MT_F_DBL, "ddot_dp_b");

         ldB   = ihiB-iloB+1; 
         pnga_get(g_b, blo, bhi, dbl_ptrB, &ldB);
      }

      sum = 0.;
      for(j=0; j< jhiA-jloA+1; j++)
          for(i=0; i< ihiA-iloA+1; i++)
             sum += *(dbl_ptrA + j*ldA + i) * 
                    *(dbl_ptrB + j*ldB + i);
      pnga_release(g_A, alo, ahi);

      if(temp_created) pnga_free(dbl_ptrB);
      else pnga_release(g_b, blo, bhi);
   }
   return sum;
}